

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

LY_ERR lyxp_vars_set(lyxp_var **vars,char *name,char *value)

{
  lyxp_var *plVar1;
  char *pcVar2;
  LY_ERR LVar3;
  char *pcVar4;
  char *__ptr;
  long *plVar5;
  long lVar6;
  lyxp_var *item;
  lyxp_var *local_20;
  
  if (value == (char *)0x0 || (name == (char *)0x0 || vars == (lyxp_var **)0x0)) {
    return LY_EINVAL;
  }
  if ((*vars != (lyxp_var *)0x0) &&
     (LVar3 = lyxp_vars_find((ly_ctx *)0x0,*vars,name,0,&local_20), LVar3 == LY_SUCCESS)) {
    pcVar4 = strdup(value);
    if (pcVar4 != (char *)0x0) {
      free(local_20->value);
      local_20->value = pcVar4;
      return LY_SUCCESS;
    }
    return LY_EMEM;
  }
  pcVar4 = strdup(name);
  __ptr = strdup(value);
  if (__ptr != (char *)0x0 && pcVar4 != (char *)0x0) {
    plVar1 = *vars;
    if (plVar1 == (lyxp_var *)0x0) {
      plVar5 = (long *)malloc(0x18);
      if (plVar5 != (long *)0x0) {
        *plVar5 = 1;
        lVar6 = 1;
        goto LAB_001259e1;
      }
    }
    else {
      pcVar2 = plVar1[-1].value;
      plVar1[-1].value = pcVar2 + 1;
      plVar5 = (long *)realloc(&plVar1[-1].value,(long)(pcVar2 + 1) * 0x10 | 8);
      if (plVar5 != (long *)0x0) {
        lVar6 = *plVar5;
LAB_001259e1:
        *vars = (lyxp_var *)(plVar5 + 1);
        plVar5[lVar6 * 2 + -1] = (long)pcVar4;
        plVar5[lVar6 * 2] = (long)__ptr;
        return LY_SUCCESS;
      }
      (*vars)[-1].value = (*vars)[-1].value + -1;
    }
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_vars_set");
  }
  free(pcVar4);
  free(__ptr);
  return LY_EMEM;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyxp_vars_set(struct lyxp_var **vars, const char *name, const char *value)
{
    LY_ERR ret = LY_SUCCESS;
    char *var_name = NULL, *var_value = NULL;
    struct lyxp_var *item;

    if (!vars || !name || !value) {
        return LY_EINVAL;
    }

    /* if variable is already defined then change its value */
    if (*vars && !lyxp_vars_find(NULL, *vars, name, 0, &item)) {
        var_value = strdup(value);
        LY_CHECK_RET(!var_value, LY_EMEM);

        /* update value */
        free(item->value);
        item->value = var_value;
    } else {
        var_name = strdup(name);
        var_value = strdup(value);
        LY_CHECK_ERR_GOTO(!var_name || !var_value, ret = LY_EMEM, error);

        /* add new variable */
        LY_ARRAY_NEW_GOTO(NULL, *vars, item, ret, error);
        item->name = var_name;
        item->value = var_value;
    }

    return LY_SUCCESS;

error:
    free(var_name);
    free(var_value);
    return ret;
}